

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eckey_impl.h
# Opt level: O3

int secp256k1_eckey_pubkey_parse(secp256k1_ge *elem,uchar *pub,size_t size)

{
  int iVar1;
  secp256k1_fe x;
  secp256k1_fe y;
  secp256k1_fe local_90;
  secp256k1_fe local_60;
  
  iVar1 = 0;
  if (size == 0x41) {
    if ((*pub < 8) && ((0xd0U >> (*pub & 0x1f) & 1) != 0)) {
      secp256k1_fe_impl_set_b32_mod(&local_90,pub + 1);
      iVar1 = 0;
      if ((local_90.n[0] < 0xffffefffffc2f) ||
         ((local_90.n[4] != 0xffffffffffff ||
          ((local_90.n[2] & local_90.n[3] & local_90.n[1]) != 0xfffffffffffff)))) {
        local_90.magnitude = 1;
        local_90.normalized = 1;
        secp256k1_fe_verify(&local_90);
        secp256k1_fe_impl_set_b32_mod(&local_60,pub + 0x21);
        if ((local_60.n[0] < 0xffffefffffc2f) ||
           ((local_60.n[4] != 0xffffffffffff ||
            ((local_60.n[2] & local_60.n[3] & local_60.n[1]) != 0xfffffffffffff)))) {
          local_60.magnitude = 1;
          local_60.normalized = 1;
          secp256k1_fe_verify(&local_60);
          secp256k1_ge_set_xy(elem,&local_90,&local_60);
          if (((*pub & 0xfe) != 6) ||
             (secp256k1_fe_verify(&local_60), (*pub != '\a') != (bool)((byte)local_60.n[0] & 1))) {
            iVar1 = secp256k1_ge_is_valid_var(elem);
          }
        }
      }
    }
  }
  else {
    iVar1 = 0;
    if (((size == 0x21) && ((*pub & 0xfe) == 2)) &&
       ((secp256k1_fe_impl_set_b32_mod(&local_90,pub + 1), local_90.n[0] < 0xffffefffffc2f ||
        ((local_90.n[4] != 0xffffffffffff ||
         (iVar1 = 0, (local_90.n[2] & local_90.n[3] & local_90.n[1]) != 0xfffffffffffff)))))) {
      local_90.magnitude = 1;
      local_90.normalized = 1;
      secp256k1_fe_verify(&local_90);
      iVar1 = secp256k1_ge_set_xo_var(elem,&local_90,(uint)(*pub == '\x03'));
    }
  }
  return iVar1;
}

Assistant:

static int secp256k1_eckey_pubkey_parse(secp256k1_ge *elem, const unsigned char *pub, size_t size) {
    if (size == 33 && (pub[0] == SECP256K1_TAG_PUBKEY_EVEN || pub[0] == SECP256K1_TAG_PUBKEY_ODD)) {
        secp256k1_fe x;
        return secp256k1_fe_set_b32_limit(&x, pub+1) && secp256k1_ge_set_xo_var(elem, &x, pub[0] == SECP256K1_TAG_PUBKEY_ODD);
    } else if (size == 65 && (pub[0] == SECP256K1_TAG_PUBKEY_UNCOMPRESSED || pub[0] == SECP256K1_TAG_PUBKEY_HYBRID_EVEN || pub[0] == SECP256K1_TAG_PUBKEY_HYBRID_ODD)) {
        secp256k1_fe x, y;
        if (!secp256k1_fe_set_b32_limit(&x, pub+1) || !secp256k1_fe_set_b32_limit(&y, pub+33)) {
            return 0;
        }
        secp256k1_ge_set_xy(elem, &x, &y);
        if ((pub[0] == SECP256K1_TAG_PUBKEY_HYBRID_EVEN || pub[0] == SECP256K1_TAG_PUBKEY_HYBRID_ODD) &&
            secp256k1_fe_is_odd(&y) != (pub[0] == SECP256K1_TAG_PUBKEY_HYBRID_ODD)) {
            return 0;
        }
        return secp256k1_ge_is_valid_var(elem);
    } else {
        return 0;
    }
}